

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeInterfaces.cpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
 __thiscall
Indexing::CodeTreeTIS<Indexing::DemodulatorData>::getGeneralizations
          (CodeTreeTIS<Indexing::DemodulatorData> *this,TypedTermList t,bool retrieveSubstitutions)

{
  bool bVar1;
  CodeTreeTIS<Indexing::DemodulatorData> *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  ResultIterator *in_RDI;
  TermList unaff_retaddr;
  IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
  *in_stack_ffffffffffffff98;
  undefined1 retrieveSubstitutions_00;
  ResultIterator *this_00;
  
  retrieveSubstitutions_00 = (undefined1)((ulong)in_RDX >> 0x38);
  this_00 = in_RDI;
  bVar1 = CodeTree::isEmpty((CodeTree *)(in_RSI + 8));
  if (bVar1) {
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
    ::getEmpty();
  }
  else {
    ResultIterator::operator_new(0x3526fd);
    ResultIterator::ResultIterator(this_00,in_RCX,unaff_retaddr,(bool)retrieveSubstitutions_00);
    Lib::
    vi<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::DemodulatorData>>
              (in_stack_ffffffffffffff98);
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
          )&in_RDI->
            super_IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
  ;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, Data>> CodeTreeTIS<Data>::getGeneralizations(TypedTermList t, bool retrieveSubstitutions)
{
  if(_ct.isEmpty()) {
    return VirtualIterator<QueryRes<ResultSubstitutionSP, Data>>::getEmpty();
  }

  return vi( new ResultIterator(this, t, retrieveSubstitutions) );
}